

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

void __thiscall Minisat::OnlineProofChecker::attachClause(OnlineProofChecker *this,CRef cr)

{
  long lVar1;
  ulong uVar2;
  Watcher local_30;
  
  lVar1 = *(long *)(this + 8);
  uVar2 = (ulong)cr;
  local_30.blocker.x = *(int *)(lVar1 + 0xc + uVar2 * 4);
  local_30.cref = cr;
  vec<Minisat::Watcher>::push
            ((vec<Minisat::Watcher> *)
             (((long)*(int *)(lVar1 + 8 + uVar2 * 4) ^ 1U) * 0x10 + *(long *)(this + 0x58)),
             &local_30);
  local_30.blocker.x = *(int *)(lVar1 + 8 + uVar2 * 4);
  local_30.cref = cr;
  vec<Minisat::Watcher>::push
            ((vec<Minisat::Watcher> *)
             (((long)*(int *)(lVar1 + 0xc + uVar2 * 4) ^ 1U) * 0x10 + *(long *)(this + 0x58)),
             &local_30);
  return;
}

Assistant:

inline void OnlineProofChecker::attachClause(CRef cr)
{
    const Clause &c = ca[cr];
    assert(c.size() > 1 && "cannot watch unit clauses!");
    assert(c.mark() == 0 && "satisfied clauses should not be attached!");

    /* do not distinguish binary and longer clauses for now */
    watches[~c[0]].push(Watcher(cr, c[1]));
    watches[~c[1]].push(Watcher(cr, c[0]));
}